

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

int Fx_ManDivFindCubeFree(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int *piVar13;
  int *piVar14;
  bool bVar15;
  
  piVar13 = vArr1->pArray + 1;
  piVar14 = vArr2->pArray + 1;
  iVar9 = vArr1->nSize;
  piVar1 = vArr1->pArray + iVar9;
  iVar8 = vArr2->nSize;
  piVar2 = vArr2->pArray + iVar8;
  vCubeFree->nSize = 0;
  if (iVar8 < 2 || (long)iVar9 < 2) {
    iVar8 = 1;
    iVar12 = 0;
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    iVar8 = 1;
    iVar12 = 0;
    do {
      iVar10 = *piVar13;
      iVar3 = *piVar14;
      if (iVar10 == iVar3) {
        piVar13 = piVar13 + 1;
        piVar14 = piVar14 + 1;
        iVar12 = iVar12 + 1;
      }
      else {
        if (iVar10 < iVar3) {
          if (iVar10 < 0) goto LAB_002c9d4e;
          piVar13 = piVar13 + 1;
          iVar10 = iVar9 + iVar10 * 2;
        }
        else {
          if (iVar3 < 0) goto LAB_002c9d4e;
          piVar14 = piVar14 + 1;
          bVar15 = vCubeFree->nSize == 0;
          if (bVar15) {
            iVar8 = 0;
          }
          if (bVar15) {
            iVar9 = 1;
          }
          iVar10 = iVar8 + iVar3 * 2;
        }
        Vec_IntPush(vCubeFree,iVar10);
      }
    } while ((piVar13 < piVar1) && (piVar14 < piVar2));
  }
  for (; piVar13 < piVar1; piVar13 = piVar13 + 1) {
    if (*piVar13 < 0) goto LAB_002c9d4e;
    Vec_IntPush(vCubeFree,iVar9 + *piVar13 * 2);
  }
  for (; piVar14 < piVar2; piVar14 = piVar14 + 1) {
    if (*piVar14 < 0) {
LAB_002c9d4e:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(vCubeFree,iVar8 + *piVar14 * 2);
  }
  iVar9 = vCubeFree->nSize;
  if (iVar9 == 3) {
    puVar4 = (uint *)vCubeFree->pArray;
    uVar7 = *puVar4;
    if (((int)uVar7 < 0) || (uVar11 = puVar4[1], (int)uVar11 < 0)) {
LAB_002c9d6d:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar5 = puVar4[2];
    if (((uVar11 ^ uVar7) & 0x7ffffffe) == 2) {
      if ((int)uVar5 < 0) goto LAB_002c9d8c;
      if (((uVar5 ^ uVar7) & 1) == 0) {
        vCubeFree->nSize = 2;
        lVar6 = 0;
        do {
          puVar4[lVar6] = puVar4[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (lVar6 < vCubeFree->nSize);
      }
      else {
        vCubeFree->nSize = 2;
        lVar6 = 1;
        do {
          puVar4[lVar6] = puVar4[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (lVar6 < vCubeFree->nSize);
      }
    }
    else {
      if ((int)uVar5 < 0) goto LAB_002c9d6d;
      if (((uVar5 ^ uVar11) & 0x7ffffffe) == 2) {
        Vec_IntDrop(vCubeFree,((uVar11 ^ uVar7) & 1) + 1);
      }
    }
    if (vCubeFree->nSize == 2) {
      if (((int)*puVar4 < 0) || ((int)puVar4[1] < 0)) goto LAB_002c9d6d;
      uVar5 = *puVar4 >> 1;
      uVar7 = puVar4[1] >> 1;
      uVar11 = uVar7;
      if (uVar5 < uVar7) {
        uVar11 = uVar5;
      }
      piVar13 = vCubeFree->pArray;
      *piVar13 = uVar11 * 2;
      if (vCubeFree->nSize < 2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      if (uVar7 < uVar5) {
        uVar7 = uVar5;
      }
      piVar13[1] = uVar7 * 2 + 1;
    }
  }
  else {
    if (iVar9 == 1) {
      return -1;
    }
    if (iVar9 == 0) {
      puts("The SOP has duplicated cubes.");
    }
  }
  if (vCubeFree->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (-1 < *vCubeFree->pArray) {
    if ((*vCubeFree->pArray & 1U) == 0) {
      return iVar12;
    }
    __assert_fail("!Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x277,"int Fx_ManDivFindCubeFree(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int *)");
  }
LAB_002c9d8c:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x130,"int Abc_LitIsCompl(int)");
}

Assistant:

int Fx_ManDivFindCubeFree( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = Vec_IntArray( vArr1 ) + 1;  // skip variable ID
    int * pBeg2 = Vec_IntArray( vArr2 ) + 1;  // skip variable ID
    int * pEnd1 = Vec_IntLimit( vArr1 );
    int * pEnd2 = Vec_IntLimit( vArr2 );
    int Counter = 0, fAttr0 = 0, fAttr1 = 1;
    Vec_IntClear( vCubeFree );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
        else  
        {
            if ( Vec_IntSize(vCubeFree) == 0 )
                fAttr0 = 1, fAttr1 = 0;
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
        }
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
    if ( Vec_IntSize(vCubeFree) == 0 )
        printf( "The SOP has duplicated cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 1 )
        return -1;
    else if ( Vec_IntSize( vCubeFree ) == 3 )
    {
        int * pArray = Vec_IntArray( vCubeFree ); 

        if ( Abc_Lit2Var( pArray[0] ) == Abc_LitNot( Abc_Lit2Var( pArray[1] ) ) )
        {
            if ( Abc_LitIsCompl( pArray[0] ) == Abc_LitIsCompl( pArray[2] ) )
                Vec_IntDrop( vCubeFree, 0 );
            else
                Vec_IntDrop( vCubeFree, 1 );
        }
        else if ( Abc_Lit2Var( pArray[1] ) == Abc_LitNot( Abc_Lit2Var( pArray[2] ) ) )
        {
            if ( Abc_LitIsCompl( pArray[1] ) == Abc_LitIsCompl( pArray[0] ) )
                Vec_IntDrop( vCubeFree, 1 );
            else
                Vec_IntDrop( vCubeFree, 2 );
        }

        if ( Vec_IntSize( vCubeFree ) == 2 )
        {
            int Lit0 = Abc_Lit2Var( pArray[0] ),
                Lit1 = Abc_Lit2Var( pArray[1] );

            if ( Lit0 > Lit1 )
                ABC_SWAP( int, Lit0, Lit1 );

            Vec_IntWriteEntry( vCubeFree, 0, Abc_Var2Lit( Lit0, 0 ) );
            Vec_IntWriteEntry( vCubeFree, 1, Abc_Var2Lit( Lit1, 1 ) );
        }
    }
    assert( !Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0)) );
    return Counter;
}